

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

_Bool scriptpubkey_is_multisig(uchar *bytes,size_t bytes_len)

{
  _Bool _Var1;
  int iVar2;
  size_t local_48;
  size_t n_push;
  size_t n_op;
  size_t n_pushes;
  size_t i;
  size_t min_1of1_len;
  size_t bytes_len_local;
  uchar *bytes_local;
  
  i = 0x25;
  if ((((bytes_len < 0x25) ||
       (min_1of1_len = bytes_len, bytes_len_local = (size_t)bytes,
       _Var1 = script_is_op_n(*bytes,false,(size_t *)0x0), !_Var1)) ||
      (*(char *)(bytes_len_local + (min_1of1_len - 1)) != -0x52)) ||
     (_Var1 = script_is_op_n(*(uchar *)(bytes_len_local + (min_1of1_len - 2)),false,&n_op), !_Var1))
  {
    bytes_local._7_1_ = false;
  }
  else {
    bytes_len_local = bytes_len_local + 1;
    min_1of1_len = min_1of1_len - 1;
    for (n_pushes = 0; n_pushes < n_op; n_pushes = n_pushes + 1) {
      iVar2 = get_push_size((uchar *)bytes_len_local,min_1of1_len,true,&n_push);
      if (((iVar2 != 0) ||
          (iVar2 = get_push_size((uchar *)bytes_len_local,min_1of1_len,false,&local_48), iVar2 != 0)
          ) || ((_Var1 = is_pk_len(local_48), !_Var1 || (min_1of1_len < n_push + local_48 + 2)))) {
        return false;
      }
      bytes_len_local = n_push + local_48 + bytes_len_local;
      min_1of1_len = min_1of1_len - (n_push + local_48);
    }
    bytes_local._7_1_ = min_1of1_len == 2;
  }
  return bytes_local._7_1_;
}

Assistant:

static bool scriptpubkey_is_multisig(const unsigned char *bytes, size_t bytes_len)
{
    const size_t min_1of1_len = 1 + 1 + 33 + 1 + 1; /* OP_1 [pubkey] OP_1 OP_CHECKMULTISIG */
    size_t i, n_pushes;

    if (bytes_len < min_1of1_len || !script_is_op_n(bytes[0], false, NULL) ||
        bytes[bytes_len - 1] != OP_CHECKMULTISIG ||
        !script_is_op_n(bytes[bytes_len - 2], false, &n_pushes))
        return false;

    ++bytes;
    --bytes_len;
    for (i = 0; i < n_pushes; ++i) {
        size_t n_op, n_push;
        if (get_push_size(bytes, bytes_len, true, &n_op) != WALLY_OK ||
            get_push_size(bytes, bytes_len, false, &n_push) != WALLY_OK ||
            !is_pk_len(n_push) || bytes_len < n_op + n_push + 2)
            return false;
        bytes += n_op + n_push;
        bytes_len -= n_op + n_push;
    }
    return bytes_len == 2;
}